

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

ManagedType __thiscall cmGeneratorTarget::CheckManagedType(cmGeneratorTarget *this,string *propval)

{
  byte bVar1;
  ManagedType MVar2;
  string *propval_local;
  cmGeneratorTarget *this_local;
  
  bVar1 = std::__cxx11::string::empty();
  MVar2 = Managed;
  if ((bVar1 & 1) != 0) {
    MVar2 = Mixed;
  }
  return MVar2;
}

Assistant:

cmGeneratorTarget::ManagedType cmGeneratorTarget::CheckManagedType(
  std::string const& propval) const
{
  // The type of the managed assembly (mixed unmanaged C++ and C++/CLI,
  // or only C++/CLI) does only depend on whether the property is an empty
  // string or contains any value at all. In Visual Studio generators
  // this propval is prepended with /clr[:] which results in:
  //
  // 1. propval does not exist: no /clr flag, unmanaged target, has import
  //                            lib
  // 2. empty propval:          add /clr as flag, mixed unmanaged/managed
  //                            target, has import lib
  // 3. any value (safe,pure):  add /clr:[propval] as flag, target with
  //                            managed code only, no import lib
  return propval.empty() ? ManagedType::Mixed : ManagedType::Managed;
}